

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

tdefl_status
tdefl_compress(tdefl_compressor *d,void *pIn_buf,size_t *pIn_buf_size,void *pOut_buf,
              size_t *pOut_buf_size,tdefl_flush flush)

{
  mz_uint *pmVar1;
  mz_uint16 *__s;
  mz_uint16 *pmVar2;
  byte bVar3;
  mz_uint8 mVar4;
  mz_uint8 mVar5;
  ushort uVar6;
  mz_uint mVar7;
  mz_uint mVar8;
  uint uVar9;
  mz_uint8 *pmVar10;
  tdefl_status tVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  mz_ulong mVar15;
  ulong uVar16;
  byte *pbVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  ulong uVar27;
  mz_uint8 *pmVar28;
  uint local_90;
  mz_uint local_7c;
  int local_50;
  ulong uVar22;
  
  if (d == (tdefl_compressor *)0x0) {
    if (pIn_buf_size != (size_t *)0x0) {
      *pIn_buf_size = 0;
    }
    if (pOut_buf_size == (size_t *)0x0) {
      return TDEFL_STATUS_BAD_PARAM;
    }
    *pOut_buf_size = 0;
    return TDEFL_STATUS_BAD_PARAM;
  }
  d->m_pIn_buf = pIn_buf;
  d->m_pIn_buf_size = pIn_buf_size;
  d->m_pOut_buf = pOut_buf;
  d->m_pOut_buf_size = pOut_buf_size;
  d->m_pSrc = (mz_uint8 *)pIn_buf;
  if (pIn_buf_size == (size_t *)0x0) {
    sVar26 = 0;
  }
  else {
    sVar26 = *pIn_buf_size;
  }
  d->m_src_buf_left = sVar26;
  d->m_out_buf_ofs = 0;
  d->m_flush = flush;
  if ((((d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) ==
        (pOut_buf != (void *)0x0 || pOut_buf_size != (size_t *)0x0)) &&
      (d->m_prev_return_status == TDEFL_STATUS_OKAY)) &&
     (flush == TDEFL_FINISH || d->m_wants_to_finish == 0)) {
    if (((pIn_buf_size == (size_t *)0x0) || (pIn_buf != (void *)0x0)) || (*pIn_buf_size == 0)) {
      if (((pOut_buf_size == (size_t *)0x0) || (pOut_buf != (void *)0x0)) || (*pOut_buf_size == 0))
      {
        d->m_wants_to_finish = d->m_wants_to_finish | (uint)(flush == TDEFL_FINISH);
        if ((d->m_output_flush_remaining == 0) && (d->m_finished == 0)) {
          __s = d->m_next;
          local_50 = (int)d + 0x92aa;
          pmVar28 = (mz_uint8 *)pIn_buf;
          do {
            do {
              if (sVar26 == 0) {
                if ((flush != TDEFL_NO_FLUSH) && (mVar7 = d->m_lookahead_size, mVar7 != 0))
                goto LAB_00197ad2;
                uVar27 = 0;
LAB_001982d8:
                d->m_pSrc = pmVar28;
                d->m_src_buf_left = uVar27;
                goto LAB_001982ea;
              }
              mVar7 = d->m_lookahead_size;
LAB_00197ad2:
              uVar21 = d->m_dict_size;
              if (uVar21 + mVar7 < 2) {
                uVar27 = sVar26;
                for (uVar14 = 0; iVar13 = (int)uVar14, sVar26 != uVar14; uVar14 = uVar14 + 1) {
                  if (0x101 < mVar7 + iVar13) goto LAB_00197c9c;
                  bVar3 = pmVar28[uVar14];
                  mVar8 = d->m_lookahead_pos;
                  uVar25 = mVar7 + iVar13 + mVar8 & 0x7fff;
                  d->m_dict[uVar25] = bVar3;
                  if (uVar25 < 0x101) {
                    d->m_dict[(ulong)uVar25 + 0x8000] = bVar3;
                  }
                  d->m_lookahead_size = mVar7 + iVar13 + 1;
                  if (2 < mVar7 + uVar21 + 1 + iVar13) {
                    uVar25 = (mVar7 - 2) + iVar13 + mVar8 & 0x7fff;
                    uVar18 = (uint)bVar3 ^
                             (uint)d->m_dict[(mVar8 + mVar7 + iVar13) - 1 & 0x7fff] << 5 ^
                             (d->m_dict[uVar25] & 0x1f) << 10;
                    d->m_next[uVar25] = d->m_hash[uVar18];
                    d->m_hash[uVar18] = ((short)mVar8 + (short)(mVar7 + iVar13)) - 2;
                  }
                  uVar27 = uVar27 - 1;
                }
                uVar27 = 0;
LAB_00197c9c:
                uVar25 = mVar7 + iVar13;
              }
              else {
                mVar8 = d->m_lookahead_pos;
                uVar18 = (mVar8 + mVar7) - 2;
                uVar23 = mVar8 + mVar7;
                uVar27 = (ulong)((uint)d->m_dict[(mVar8 + mVar7) - 1 & 0x7fff] ^
                                (uint)d->m_dict[uVar18 & 0x7fff] << 5);
                uVar14 = sVar26 & 0xffffffff;
                if (0x102 - mVar7 <= sVar26) {
                  uVar14 = (ulong)(0x102 - mVar7);
                }
                uVar25 = (int)uVar14 + mVar7;
                d->m_lookahead_size = uVar25;
                for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                  uVar23 = uVar23 & 0x7fff;
                  bVar3 = pmVar28[uVar16];
                  d->m_dict[uVar23] = bVar3;
                  if (uVar23 < 0x101) {
                    d->m_dict[(ulong)uVar23 + 0x8000] = bVar3;
                  }
                  uVar27 = (ulong)(((uint)uVar27 & 0x3ff) << 5 ^ (uint)bVar3);
                  d->m_next[uVar18 & 0x7fff] = d->m_hash[uVar27];
                  d->m_hash[uVar27] = (mz_uint16)uVar18;
                  uVar23 = uVar23 + 1;
                  uVar18 = uVar18 + 1;
                }
                uVar27 = sVar26 - uVar14;
              }
              pmVar28 = pmVar28 + uVar14;
              uVar18 = 0x8000 - uVar25;
              if (uVar21 <= 0x8000 - uVar25) {
                uVar18 = uVar21;
              }
              d->m_dict_size = uVar18;
              if ((flush == TDEFL_NO_FLUSH) && (uVar25 < 0x102)) goto LAB_001982d8;
              uVar21 = d->m_saved_match_len;
              uVar14 = (ulong)uVar21;
              if (uVar21 == 0) {
                uVar14 = 2;
              }
              uVar20 = (uint)uVar14;
              uVar23 = d->m_flags;
              uVar9 = d->m_lookahead_pos;
              uVar19 = uVar9 & 0x7fff;
              uVar16 = (ulong)uVar19;
              if ((uVar23 & 0x90000) == 0) {
                if (0x102 < uVar25) {
                  __assert_fail("max_match_len <= TDEFL_MAX_MATCH_LEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                                ,0xdd0,
                                "void (anonymous namespace)::miniz::tdefl_find_match(tdefl_compressor *, mz_uint, mz_uint, mz_uint, mz_uint *, mz_uint *)"
                               );
                }
                if (uVar20 < uVar25) {
                  local_7c = d->m_max_probes[0x1f < uVar20];
                  local_90 = 0;
                  uVar22 = uVar16;
                  do {
                    uVar12 = (uint)uVar14;
                    mVar4 = d->m_dict[(uVar19 + uVar20) - 1];
                    mVar5 = d->m_dict[uVar19 + uVar20];
                    do {
                      mVar7 = local_7c - 1;
                      do {
                        local_7c = mVar7;
                        if ((local_7c == 0) || (uVar6 = __s[uVar22], uVar6 == 0)) goto LAB_00197f11;
                        uVar24 = uVar9 - uVar6 & 0xffff;
                        if (uVar18 < uVar24) goto LAB_00197f11;
                        uVar20 = uVar6 & 0x7fff;
                        uVar22 = (ulong)uVar20;
                        uVar20 = uVar12 + uVar20;
                        if ((d->m_dict[uVar20] == mVar5) && (d->m_dict[uVar20 - 1] == mVar4)) break;
                        uVar6 = __s[uVar22];
                        if (uVar6 == 0) goto LAB_00197f11;
                        uVar24 = uVar9 - uVar6 & 0xffff;
                        if (uVar18 < uVar24) goto LAB_00197f11;
                        uVar20 = uVar6 & 0x7fff;
                        uVar22 = (ulong)uVar20;
                        uVar20 = uVar12 + uVar20;
                        if ((d->m_dict[uVar20] == mVar5) && (d->m_dict[uVar20 - 1] == mVar4)) break;
                        uVar6 = __s[uVar22];
                        if (uVar6 == 0) goto LAB_00197f11;
                        uVar24 = uVar9 - uVar6 & 0xffff;
                        if (uVar18 < uVar24) goto LAB_00197f11;
                        uVar20 = uVar6 & 0x7fff;
                        uVar22 = (ulong)uVar20;
                        uVar20 = uVar12 + uVar20;
                        mVar7 = local_7c - 1;
                      } while ((d->m_dict[uVar20] != mVar5) || (d->m_dict[uVar20 - 1] != mVar4));
                      if (uVar24 == 0) goto LAB_00197f11;
                      for (uVar14 = 0; uVar25 != (uint)uVar14; uVar14 = uVar14 + 1) {
                        if (d->m_dict[uVar14 + uVar16] != d->m_dict[uVar14 + uVar22])
                        goto LAB_00197ebf;
                      }
                      uVar14 = (ulong)uVar25;
LAB_00197ebf:
                      uVar20 = (uint)uVar14;
                    } while (uVar20 <= uVar12);
                    local_90 = uVar24;
                    uVar12 = uVar25;
                    if (uVar20 == uVar25) goto LAB_00197f11;
                    uVar14 = uVar14 & 0xffffffff;
                  } while( true );
                }
LAB_00197ee9:
                local_90 = 0;
                uVar12 = uVar20;
              }
              else {
                if ((uVar23 >> 0x13 & 1) != 0 || uVar18 == 0) goto LAB_00197ee9;
                uVar14 = 0;
                do {
                  if (uVar25 == uVar14) goto LAB_00197f00;
                  iVar13 = (int)uVar14;
                  uVar14 = uVar14 + 1;
                } while (d->m_dict[(uVar9 & 0x7fff) + iVar13] == d->m_dict[uVar9 - 1 & 0x7fff]);
                uVar25 = (int)uVar14 - 1;
LAB_00197f00:
                local_90 = (uint)(2 < uVar25);
                uVar12 = uVar25;
                if (2 >= uVar25) {
                  uVar12 = 0;
                }
              }
LAB_00197f11:
              if (((uVar12 == 3 && 0x1fff < local_90) || (uVar19 == local_90)) ||
                 (((uVar23 >> 0x11 & 1) != 0 && (uVar12 < 6)))) {
                if (uVar21 != 0) {
LAB_00197f48:
                  if ((uVar21 < 3) || (uVar25 = d->m_saved_match_dist - 1, 0x7fff < uVar25)) {
LAB_001983a9:
                    __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                                  ,0xebd,
                                  "void (anonymous namespace)::miniz::tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)"
                                 );
                  }
                  d->m_total_lz_bytes = d->m_total_lz_bytes + uVar21;
                  *d->m_pLZ_code_buf = (mz_uint8)(uVar21 - 3);
                  d->m_pLZ_code_buf[1] = (mz_uint8)uVar25;
                  d->m_pLZ_code_buf[2] = (mz_uint8)(uVar25 >> 8);
                  d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                  *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                  pmVar1 = &d->m_num_flags_left;
                  *pmVar1 = *pmVar1 - 1;
                  if (*pmVar1 == 0) {
                    d->m_num_flags_left = 8;
                    pmVar10 = d->m_pLZ_code_buf;
                    d->m_pLZ_code_buf = pmVar10 + 1;
                    d->m_pLZ_flags = pmVar10;
                  }
                  pbVar17 = "" + (uVar25 >> 8);
                  if (uVar25 < 0x200) {
                    pbVar17 = "" + (uVar25 & 0x1ff);
                  }
                  pmVar2 = d->m_huff_count[1] + *pbVar17;
                  *pmVar2 = *pmVar2 + 1;
                  pmVar2 = d->m_huff_count[0] +
                           (anonymous_namespace)::miniz::s_tdefl_len_sym[uVar21 - 3];
                  *pmVar2 = *pmVar2 + 1;
                  uVar12 = d->m_saved_match_len - 1;
                  goto LAB_00197ffd;
                }
LAB_001981d2:
                bVar3 = d->m_dict[uVar16];
                d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
                pbVar17 = d->m_pLZ_code_buf;
                d->m_pLZ_code_buf = pbVar17 + 1;
                *pbVar17 = bVar3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar10 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar10 + 1;
                  d->m_pLZ_flags = pmVar10;
                }
                pmVar2 = d->m_huff_count[0] + bVar3;
                *pmVar2 = *pmVar2 + 1;
LAB_00198215:
                uVar12 = 1;
              }
              else if (uVar21 == 0) {
                if (local_90 == 0) goto LAB_001981d2;
                if (((d->m_greedy_parsing == 0) && ((uVar23 >> 0x10 & 1) == 0)) && (uVar12 < 0x80))
                {
                  bVar3 = d->m_dict[uVar16];
                  goto LAB_001982ba;
                }
                if ((0x8000 < local_90) || (uVar12 < 3)) goto LAB_001983a9;
                uVar21 = local_90 - 1;
                d->m_total_lz_bytes = d->m_total_lz_bytes + uVar12;
                *d->m_pLZ_code_buf = (mz_uint8)(uVar12 - 3);
                d->m_pLZ_code_buf[1] = (mz_uint8)uVar21;
                d->m_pLZ_code_buf[2] = (mz_uint8)(uVar21 >> 8);
                d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar10 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar10 + 1;
                  d->m_pLZ_flags = pmVar10;
                }
                pbVar17 = "" + (uVar21 >> 8);
                if (local_90 < 0x201) {
                  pbVar17 = "" + (uVar21 & 0x1ff);
                }
                pmVar2 = d->m_huff_count[1] + *pbVar17;
                *pmVar2 = *pmVar2 + 1;
                pmVar2 = d->m_huff_count[0] +
                         (anonymous_namespace)::miniz::s_tdefl_len_sym[uVar12 - 3];
                *pmVar2 = *pmVar2 + 1;
              }
              else {
                if (uVar12 <= uVar21) goto LAB_00197f48;
                uVar21 = d->m_saved_lit;
                d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
                pmVar10 = d->m_pLZ_code_buf;
                d->m_pLZ_code_buf = pmVar10 + 1;
                *pmVar10 = (mz_uint8)uVar21;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar10 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar10 + 1;
                  d->m_pLZ_flags = pmVar10;
                }
                pmVar2 = d->m_huff_count[0] + (uVar21 & 0xff);
                *pmVar2 = *pmVar2 + 1;
                if (uVar12 < 0x80) {
                  bVar3 = d->m_dict[uVar16];
LAB_001982ba:
                  d->m_saved_lit = (uint)bVar3;
                  d->m_saved_match_dist = local_90;
                  d->m_saved_match_len = uVar12;
                  goto LAB_00198215;
                }
                local_90 = local_90 - 1;
                if (0x7fff < local_90) goto LAB_001983a9;
                d->m_total_lz_bytes = d->m_total_lz_bytes + uVar12;
                *d->m_pLZ_code_buf = (mz_uint8)(uVar12 - 3);
                d->m_pLZ_code_buf[1] = (mz_uint8)local_90;
                d->m_pLZ_code_buf[2] = (mz_uint8)(local_90 >> 8);
                d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar10 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar10 + 1;
                  d->m_pLZ_flags = pmVar10;
                }
                pbVar17 = "" + (local_90 >> 8);
                if (local_90 < 0x200) {
                  pbVar17 = "" + (local_90 & 0x1ff);
                }
                pmVar2 = d->m_huff_count[1] + *pbVar17;
                *pmVar2 = *pmVar2 + 1;
                pmVar2 = d->m_huff_count[0] +
                         (anonymous_namespace)::miniz::s_tdefl_len_sym[uVar12 - 3];
                *pmVar2 = *pmVar2 + 1;
LAB_00197ffd:
                d->m_saved_match_len = 0;
              }
              d->m_lookahead_pos = d->m_lookahead_pos + uVar12;
              if (d->m_lookahead_size < uVar12) {
                __assert_fail("d->m_lookahead_size >= len_to_move",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                              ,0xf4e,
                              "mz_bool (anonymous namespace)::miniz::tdefl_compress_normal(tdefl_compressor *)"
                             );
              }
              d->m_lookahead_size = d->m_lookahead_size - uVar12;
              uVar12 = uVar12 + d->m_dict_size;
              if (0x7fff < uVar12) {
                uVar12 = 0x8000;
              }
              d->m_dict_size = uVar12;
              sVar26 = uVar27;
            } while ((d->m_pLZ_code_buf <= d->m_lz_code_buf + 0xfff8) &&
                    ((d->m_total_lz_bytes < 0x7c01 ||
                     (((uint)(((int)d->m_pLZ_code_buf - local_50) * 0x73) >> 7 < d->m_total_lz_bytes
                      && ((d->m_flags & 0x80000) == 0))))));
            d->m_pSrc = pmVar28;
            d->m_src_buf_left = uVar27;
            iVar13 = (anonymous_namespace)::miniz::tdefl_flush_block(d,0);
          } while (iVar13 == 0);
          if (iVar13 < 0) {
LAB_0019837f:
            return d->m_prev_return_status;
          }
LAB_001982ea:
          if ((pIn_buf != (void *)0x0) && ((d->m_flags & 0x3000) != 0)) {
            mVar15 = mz_adler32((ulong)d->m_adler32,(uchar *)pIn_buf,(long)d->m_pSrc - (long)pIn_buf
                               );
            d->m_adler32 = (mz_uint)mVar15;
          }
          if ((((flush != TDEFL_NO_FLUSH) && (d->m_lookahead_size == 0)) && (d->m_src_buf_left == 0)
              ) && (d->m_output_flush_remaining == 0)) {
            iVar13 = (anonymous_namespace)::miniz::tdefl_flush_block(d,flush);
            if (iVar13 < 0) goto LAB_0019837f;
            d->m_finished = (uint)(flush == TDEFL_FINISH);
            if (flush == TDEFL_FULL_FLUSH) {
              d->m_dict_size = 0;
              memset(__s,0,0x20000);
            }
          }
        }
        tVar11 = (anonymous_namespace)::miniz::tdefl_flush_output_buffer(d);
        d->m_prev_return_status = tVar11;
        return tVar11;
      }
      goto LAB_001979f6;
    }
  }
  else {
LAB_001979f6:
    if (pIn_buf_size == (size_t *)0x0) goto LAB_001979ff;
  }
  *pIn_buf_size = 0;
LAB_001979ff:
  if (pOut_buf_size != (size_t *)0x0) {
    *pOut_buf_size = 0;
  }
  d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM;
  return TDEFL_STATUS_BAD_PARAM;
}

Assistant:

tdefl_status tdefl_compress(tdefl_compressor *d, const void *pIn_buf,
                            size_t *pIn_buf_size, void *pOut_buf,
                            size_t *pOut_buf_size, tdefl_flush flush) {
  if (!d) {
    if (pIn_buf_size)
      *pIn_buf_size = 0;
    if (pOut_buf_size)
      *pOut_buf_size = 0;
    return TDEFL_STATUS_BAD_PARAM;
  }

  d->m_pIn_buf = pIn_buf;
  d->m_pIn_buf_size = pIn_buf_size;
  d->m_pOut_buf = pOut_buf;
  d->m_pOut_buf_size = pOut_buf_size;
  d->m_pSrc = (const mz_uint8 *)(pIn_buf);
  d->m_src_buf_left = pIn_buf_size ? *pIn_buf_size : 0;
  d->m_out_buf_ofs = 0;
  d->m_flush = flush;

  if (((d->m_pPut_buf_func != NULL) ==
       ((pOut_buf != NULL) || (pOut_buf_size != NULL))) ||
      (d->m_prev_return_status != TDEFL_STATUS_OKAY) ||
      (d->m_wants_to_finish && (flush != TDEFL_FINISH)) ||
      (pIn_buf_size && *pIn_buf_size && !pIn_buf) ||
      (pOut_buf_size && *pOut_buf_size && !pOut_buf)) {
    if (pIn_buf_size)
      *pIn_buf_size = 0;
    if (pOut_buf_size)
      *pOut_buf_size = 0;
    return (d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM);
  }
  d->m_wants_to_finish |= (flush == TDEFL_FINISH);

  if ((d->m_output_flush_remaining) || (d->m_finished))
    return (d->m_prev_return_status = tdefl_flush_output_buffer(d));

#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN
  if (((d->m_flags & TDEFL_MAX_PROBES_MASK) == 1) &&
      ((d->m_flags & TDEFL_GREEDY_PARSING_FLAG) != 0) &&
      ((d->m_flags & (TDEFL_FILTER_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS |
                      TDEFL_RLE_MATCHES)) == 0)) {
    if (!tdefl_compress_fast(d))
      return d->m_prev_return_status;
  } else
#endif // #if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN
  {
    if (!tdefl_compress_normal(d))
      return d->m_prev_return_status;
  }

  if ((d->m_flags & (TDEFL_WRITE_ZLIB_HEADER | TDEFL_COMPUTE_ADLER32)) &&
      (pIn_buf))
    d->m_adler32 =
        (mz_uint32)mz_adler32(d->m_adler32, (const mz_uint8 *)pIn_buf,
                              d->m_pSrc - (const mz_uint8 *)pIn_buf);

  if ((flush) && (!d->m_lookahead_size) && (!d->m_src_buf_left) &&
      (!d->m_output_flush_remaining)) {
    if (tdefl_flush_block(d, flush) < 0)
      return d->m_prev_return_status;
    d->m_finished = (flush == TDEFL_FINISH);
    if (flush == TDEFL_FULL_FLUSH) {
      MZ_CLEAR_OBJ(d->m_hash);
      MZ_CLEAR_OBJ(d->m_next);
      d->m_dict_size = 0;
    }
  }

  return (d->m_prev_return_status = tdefl_flush_output_buffer(d));
}